

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  long lVar13;
  undefined1 auVar14 [32];
  AABBNodeMB4D *node1;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  NodeRef *pNVar23;
  ulong uVar24;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  size_t sVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar71 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar86 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  UVIdentity<4> mapUV;
  NodeRef *local_1558;
  undefined1 local_1508 [16];
  ulong local_14f0;
  long local_14e8;
  long local_14e0;
  ulong local_14d8;
  ulong local_14d0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined1 local_1468 [16];
  undefined1 local_1458 [16];
  undefined1 local_1448 [16];
  UVIdentity<4> *local_1438;
  byte local_1430;
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [32];
  undefined1 local_13a8 [32];
  undefined1 local_1388 [32];
  undefined1 local_1368 [32];
  undefined1 local_1348 [32];
  RTCHitN local_1328 [16];
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [16];
  uint local_12b8;
  uint uStack_12b4;
  uint uStack_12b0;
  uint uStack_12ac;
  uint uStack_12a8;
  uint uStack_12a4;
  uint uStack_12a0;
  uint uStack_129c;
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  NodeRef stack [564];
  
  stack[0] = root;
  auVar56 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar97 = ZEXT3264(auVar56);
  auVar56 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar98 = ZEXT3264(auVar56);
  auVar56 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar99 = ZEXT3264(auVar56);
  fVar70 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar78 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar56 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar70 * 0.99999964)));
  auVar100 = ZEXT3264(auVar56);
  auVar56 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar78 * 0.99999964)));
  auVar101 = ZEXT3264(auVar56);
  fVar63 = fVar85 * 0.99999964;
  fVar70 = fVar70 * 1.0000004;
  fVar78 = fVar78 * 1.0000004;
  fVar85 = fVar85 * 1.0000004;
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar21 = uVar28 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  local_1278._4_4_ = iVar2;
  local_1278._0_4_ = iVar2;
  local_1278._8_4_ = iVar2;
  local_1278._12_4_ = iVar2;
  local_1278._16_4_ = iVar2;
  local_1278._20_4_ = iVar2;
  local_1278._24_4_ = iVar2;
  local_1278._28_4_ = iVar2;
  auVar93 = ZEXT3264(local_1278);
  iVar2 = (tray->tfar).field_0.i[k];
  local_1298._4_4_ = iVar2;
  local_1298._0_4_ = iVar2;
  local_1298._8_4_ = iVar2;
  local_1298._12_4_ = iVar2;
  local_1298._16_4_ = iVar2;
  local_1298._20_4_ = iVar2;
  local_1298._24_4_ = iVar2;
  local_1298._28_4_ = iVar2;
  auVar95 = ZEXT3264(local_1298);
  auVar12 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar96 = ZEXT1664(ZEXT816(0) << 0x40);
  local_11f8 = fVar63;
  fStack_11f4 = fVar63;
  fStack_11f0 = fVar63;
  fStack_11ec = fVar63;
  fStack_11e8 = fVar63;
  fStack_11e4 = fVar63;
  fStack_11e0 = fVar63;
  fStack_11dc = fVar63;
  local_1218 = fVar70;
  fStack_1214 = fVar70;
  fStack_1210 = fVar70;
  fStack_120c = fVar70;
  fStack_1208 = fVar70;
  fStack_1204 = fVar70;
  fStack_1200 = fVar70;
  fStack_11fc = fVar70;
  local_1238 = fVar78;
  fStack_1234 = fVar78;
  fStack_1230 = fVar78;
  fStack_122c = fVar78;
  fStack_1228 = fVar78;
  fStack_1224 = fVar78;
  fStack_1220 = fVar78;
  fStack_121c = fVar78;
  local_1258 = fVar85;
  fStack_1254 = fVar85;
  fStack_1250 = fVar85;
  fStack_124c = fVar85;
  fStack_1248 = fVar85;
  fStack_1244 = fVar85;
  fStack_1240 = fVar85;
  fStack_123c = fVar85;
  local_1558 = stack + 1;
  fVar64 = fVar63;
  fVar65 = fVar63;
  fVar66 = fVar63;
  fVar67 = fVar63;
  fVar68 = fVar63;
  fVar69 = fVar63;
  fVar72 = fVar70;
  fVar73 = fVar70;
  fVar74 = fVar70;
  fVar75 = fVar70;
  fVar76 = fVar70;
  fVar77 = fVar70;
  fVar79 = fVar78;
  fVar80 = fVar78;
  fVar81 = fVar78;
  fVar82 = fVar78;
  fVar83 = fVar78;
  fVar84 = fVar78;
  fVar87 = fVar85;
  fVar88 = fVar85;
  fVar89 = fVar85;
  fVar90 = fVar85;
  fVar91 = fVar85;
  fVar92 = fVar85;
  local_14f0 = uVar28;
LAB_01da2d4a:
  do {
    pNVar23 = local_1558;
    if (pNVar23 == stack) {
LAB_01da394a:
      return pNVar23 != stack;
    }
    local_1558 = pNVar23 + -1;
    sVar30 = pNVar23[-1].ptr;
    while ((sVar30 & 8) == 0) {
      uVar15 = sVar30 & 0xfffffffffffffff0;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar60._4_4_ = uVar3;
      auVar60._0_4_ = uVar3;
      auVar60._8_4_ = uVar3;
      auVar60._12_4_ = uVar3;
      auVar60._16_4_ = uVar3;
      auVar60._20_4_ = uVar3;
      auVar60._24_4_ = uVar3;
      auVar60._28_4_ = uVar3;
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar28),auVar60,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar28));
      auVar56 = vsubps_avx512vl(ZEXT1632(auVar44),auVar97._0_32_);
      auVar56 = vmulps_avx512vl(auVar100._0_32_,auVar56);
      auVar56 = vmaxps_avx(auVar93._0_32_,auVar56);
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar20),auVar60,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar20));
      auVar57 = vsubps_avx512vl(ZEXT1632(auVar44),auVar98._0_32_);
      auVar58 = vmulps_avx512vl(auVar101._0_32_,auVar57);
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar31),auVar60,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar31));
      auVar59 = vsubps_avx512vl(ZEXT1632(auVar44),auVar99._0_32_);
      auVar57._4_4_ = fVar64 * auVar59._4_4_;
      auVar57._0_4_ = fVar63 * auVar59._0_4_;
      auVar57._8_4_ = fVar65 * auVar59._8_4_;
      auVar57._12_4_ = fVar66 * auVar59._12_4_;
      auVar57._16_4_ = fVar67 * auVar59._16_4_;
      auVar57._20_4_ = fVar68 * auVar59._20_4_;
      auVar57._24_4_ = fVar69 * auVar59._24_4_;
      auVar57._28_4_ = auVar59._28_4_;
      auVar57 = vmaxps_avx(auVar58,auVar57);
      auVar56 = vmaxps_avx(auVar56,auVar57);
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar21),auVar60,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar21));
      auVar57 = vsubps_avx512vl(ZEXT1632(auVar44),auVar97._0_32_);
      auVar58._4_4_ = fVar72 * auVar57._4_4_;
      auVar58._0_4_ = fVar70 * auVar57._0_4_;
      auVar58._8_4_ = fVar73 * auVar57._8_4_;
      auVar58._12_4_ = fVar74 * auVar57._12_4_;
      auVar58._16_4_ = fVar75 * auVar57._16_4_;
      auVar58._20_4_ = fVar76 * auVar57._20_4_;
      auVar58._24_4_ = fVar77 * auVar57._24_4_;
      auVar58._28_4_ = auVar57._28_4_;
      auVar57 = vminps_avx(auVar95._0_32_,auVar58);
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + (uVar20 ^ 0x20)),auVar60,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + (uVar20 ^ 0x20)));
      auVar58 = vsubps_avx512vl(ZEXT1632(auVar44),auVar98._0_32_);
      auVar59._4_4_ = fVar79 * auVar58._4_4_;
      auVar59._0_4_ = fVar78 * auVar58._0_4_;
      auVar59._8_4_ = fVar80 * auVar58._8_4_;
      auVar59._12_4_ = fVar81 * auVar58._12_4_;
      auVar59._16_4_ = fVar82 * auVar58._16_4_;
      auVar59._20_4_ = fVar83 * auVar58._20_4_;
      auVar59._24_4_ = fVar84 * auVar58._24_4_;
      auVar59._28_4_ = auVar58._28_4_;
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + (uVar31 ^ 0x20)),auVar60,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + (uVar31 ^ 0x20)));
      auVar58 = vsubps_avx512vl(ZEXT1632(auVar44),auVar99._0_32_);
      auVar14._4_4_ = fVar87 * auVar58._4_4_;
      auVar14._0_4_ = fVar85 * auVar58._0_4_;
      auVar14._8_4_ = fVar88 * auVar58._8_4_;
      auVar14._12_4_ = fVar89 * auVar58._12_4_;
      auVar14._16_4_ = fVar90 * auVar58._16_4_;
      auVar14._20_4_ = fVar91 * auVar58._20_4_;
      auVar14._24_4_ = fVar92 * auVar58._24_4_;
      auVar14._28_4_ = auVar58._28_4_;
      auVar58 = vminps_avx(auVar59,auVar14);
      auVar57 = vminps_avx(auVar57,auVar58);
      if (((uint)sVar30 & 7) == 6) {
        uVar9 = vcmpps_avx512vl(auVar56,auVar57,2);
        uVar10 = vcmpps_avx512vl(auVar60,*(undefined1 (*) [32])(uVar15 + 0x1c0),0xd);
        uVar11 = vcmpps_avx512vl(auVar60,*(undefined1 (*) [32])(uVar15 + 0x1e0),1);
        uVar16 = (uint)uVar9 & (uint)uVar10 & (uint)uVar11;
      }
      else {
        uVar9 = vcmpps_avx512vl(auVar56,auVar57,2);
        uVar16 = (uint)uVar9;
      }
      if ((byte)uVar16 == 0) goto LAB_01da2d4a;
      lVar13 = 0;
      for (uVar17 = (ulong)(byte)uVar16; (uVar17 & 1) == 0;
          uVar17 = uVar17 >> 1 | 0x8000000000000000) {
        lVar13 = lVar13 + 1;
      }
      sVar30 = *(size_t *)(uVar15 + lVar13 * 8);
      uVar16 = (uVar16 & 0xff) - 1 & uVar16 & 0xff;
      uVar17 = (ulong)uVar16;
      if (uVar16 != 0) {
        do {
          local_1558->ptr = sVar30;
          local_1558 = local_1558 + 1;
          lVar13 = 0;
          for (uVar32 = uVar17; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
            lVar13 = lVar13 + 1;
          }
          uVar17 = uVar17 - 1 & uVar17;
          sVar30 = *(size_t *)(uVar15 + lVar13 * 8);
        } while (uVar17 != 0);
      }
    }
    local_14e0 = (ulong)((uint)sVar30 & 0xf) - 8;
    uVar15 = sVar30 & 0xfffffffffffffff0;
    for (local_14e8 = 0; local_14e8 != local_14e0; local_14e8 = local_14e8 + 1) {
      lVar19 = local_14e8 * 0x50;
      pSVar5 = context->scene;
      pGVar6 = (pSVar5->geometries).items[*(uint *)(uVar15 + 0x30 + lVar19)].ptr;
      fVar70 = (pGVar6->time_range).lower;
      fVar70 = pGVar6->fnumTimeSegments *
               ((*(float *)(ray + k * 4 + 0x70) - fVar70) / ((pGVar6->time_range).upper - fVar70));
      auVar44 = vroundss_avx(ZEXT416((uint)fVar70),ZEXT416((uint)fVar70),9);
      auVar44 = vminss_avx(auVar44,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
      auVar62 = vmaxss_avx(auVar96._0_16_,auVar44);
      lVar18 = (long)(int)auVar62._0_4_ * 0x38;
      uVar26 = (ulong)*(uint *)(uVar15 + 4 + lVar19);
      lVar13 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar18);
      lVar18 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar18);
      auVar44 = *(undefined1 (*) [16])(lVar13 + (ulong)*(uint *)(uVar15 + lVar19) * 4);
      uVar28 = (ulong)*(uint *)(uVar15 + 0x10 + lVar19);
      auVar47 = *(undefined1 (*) [16])(lVar13 + uVar28 * 4);
      uVar17 = (ulong)*(uint *)(uVar15 + 0x20 + lVar19);
      auVar52 = *(undefined1 (*) [16])(lVar13 + uVar17 * 4);
      auVar33 = *(undefined1 (*) [16])(lVar13 + uVar26 * 4);
      local_14d0 = (ulong)*(uint *)(uVar15 + 0x14 + lVar19);
      auVar49 = *(undefined1 (*) [16])(lVar13 + local_14d0 * 4);
      local_14d8 = (ulong)*(uint *)(uVar15 + 0x24 + lVar19);
      auVar50 = *(undefined1 (*) [16])(lVar13 + local_14d8 * 4);
      uVar29 = (ulong)*(uint *)(uVar15 + 8 + lVar19);
      auVar34 = *(undefined1 (*) [16])(lVar13 + uVar29 * 4);
      uVar27 = (ulong)*(uint *)(uVar15 + 0x18 + lVar19);
      auVar36 = *(undefined1 (*) [16])(lVar13 + uVar27 * 4);
      uVar25 = (ulong)*(uint *)(uVar15 + 0x28 + lVar19);
      auVar48 = *(undefined1 (*) [16])(lVar13 + uVar25 * 4);
      uVar24 = (ulong)*(uint *)(uVar15 + 0xc + lVar19);
      auVar45 = *(undefined1 (*) [16])(lVar13 + uVar24 * 4);
      uVar22 = (ulong)*(uint *)(uVar15 + 0x1c + lVar19);
      auVar46 = *(undefined1 (*) [16])(lVar13 + uVar22 * 4);
      uVar32 = (ulong)*(uint *)(uVar15 + 0x2c + lVar19);
      auVar35 = *(undefined1 (*) [16])(lVar13 + uVar32 * 4);
      auVar37 = *(undefined1 (*) [16])(lVar18 + (ulong)*(uint *)(uVar15 + lVar19) * 4);
      auVar38 = *(undefined1 (*) [16])(lVar18 + uVar28 * 4);
      auVar41 = *(undefined1 (*) [16])(lVar18 + uVar17 * 4);
      auVar39 = *(undefined1 (*) [16])(lVar18 + uVar26 * 4);
      auVar40 = *(undefined1 (*) [16])(lVar18 + local_14d0 * 4);
      auVar42 = *(undefined1 (*) [16])(lVar18 + local_14d8 * 4);
      auVar43 = *(undefined1 (*) [16])(lVar18 + uVar29 * 4);
      auVar51 = *(undefined1 (*) [16])(lVar18 + uVar27 * 4);
      auVar53 = *(undefined1 (*) [16])(lVar18 + uVar25 * 4);
      auVar54 = *(undefined1 (*) [16])(lVar18 + uVar24 * 4);
      auVar55 = *(undefined1 (*) [16])(lVar18 + uVar22 * 4);
      auVar61 = *(undefined1 (*) [16])(lVar18 + uVar32 * 4);
      puVar1 = (undefined8 *)(uVar15 + 0x30 + lVar19);
      local_1478 = *puVar1;
      uStack_1470 = puVar1[1];
      puVar1 = (undefined8 *)(uVar15 + 0x40 + lVar19);
      auVar71 = vunpcklps_avx(auVar44,auVar34);
      auVar44 = vunpckhps_avx(auVar44,auVar34);
      auVar34 = vunpcklps_avx(auVar33,auVar45);
      auVar33 = vunpckhps_avx(auVar33,auVar45);
      auVar45 = vunpcklps_avx(auVar44,auVar33);
      auVar86 = vunpcklps_avx(auVar71,auVar34);
      auVar44 = vunpckhps_avx(auVar71,auVar34);
      auVar34 = vunpcklps_avx(auVar47,auVar36);
      auVar47 = vunpckhps_avx(auVar47,auVar36);
      auVar36 = vunpcklps_avx(auVar49,auVar46);
      auVar33 = vunpckhps_avx(auVar49,auVar46);
      auVar49 = vunpcklps_avx(auVar47,auVar33);
      auVar46 = vunpcklps_avx(auVar34,auVar36);
      auVar47 = vunpckhps_avx(auVar34,auVar36);
      auVar34 = vunpcklps_avx(auVar52,auVar48);
      auVar52 = vunpckhps_avx(auVar52,auVar48);
      auVar36 = vunpcklps_avx(auVar50,auVar35);
      auVar33 = vunpckhps_avx(auVar50,auVar35);
      auVar50 = vunpcklps_avx(auVar52,auVar33);
      auVar48 = vunpcklps_avx(auVar34,auVar36);
      auVar52 = vunpckhps_avx(auVar34,auVar36);
      auVar33 = vunpcklps_avx512vl(auVar37,auVar43);
      auVar34 = vunpckhps_avx512vl(auVar37,auVar43);
      auVar35 = vunpcklps_avx512vl(auVar39,auVar54);
      auVar36 = vunpckhps_avx512vl(auVar39,auVar54);
      auVar34 = vunpcklps_avx(auVar34,auVar36);
      auVar36 = vunpcklps_avx(auVar33,auVar35);
      auVar33 = vunpckhps_avx(auVar33,auVar35);
      auVar35 = vunpcklps_avx512vl(auVar38,auVar51);
      auVar37 = vunpckhps_avx512vl(auVar38,auVar51);
      auVar38 = vunpcklps_avx512vl(auVar40,auVar55);
      auVar39 = vunpckhps_avx512vl(auVar40,auVar55);
      auVar37 = vunpcklps_avx512vl(auVar37,auVar39);
      auVar39 = vunpcklps_avx512vl(auVar35,auVar38);
      auVar38 = vunpckhps_avx512vl(auVar35,auVar38);
      auVar40 = vunpcklps_avx512vl(auVar41,auVar53);
      auVar35 = vunpckhps_avx512vl(auVar41,auVar53);
      auVar41 = vunpcklps_avx512vl(auVar42,auVar61);
      auVar42 = vunpckhps_avx512vl(auVar42,auVar61);
      auVar35 = vunpcklps_avx(auVar35,auVar42);
      auVar42 = vunpcklps_avx512vl(auVar40,auVar41);
      auVar41 = vunpckhps_avx512vl(auVar40,auVar41);
      auVar43 = ZEXT416((uint)(fVar70 - auVar62._0_4_));
      auVar40 = vbroadcastss_avx512vl(auVar43);
      auVar43 = vsubss_avx512f(ZEXT416(0x3f800000),auVar43);
      auVar51._0_4_ = auVar43._0_4_;
      auVar51._4_4_ = auVar51._0_4_;
      auVar51._8_4_ = auVar51._0_4_;
      auVar51._12_4_ = auVar51._0_4_;
      auVar36 = vmulps_avx512vl(auVar40,auVar36);
      auVar43 = vmulps_avx512vl(auVar40,auVar33);
      auVar34 = vmulps_avx512vl(auVar40,auVar34);
      auVar33 = vfmadd231ps_fma(auVar36,auVar51,auVar86);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar51,auVar44);
      auVar34 = vfmadd231ps_fma(auVar34,auVar51,auVar45);
      auVar44 = vmulps_avx512vl(auVar40,auVar39);
      auVar45 = vmulps_avx512vl(auVar40,auVar38);
      auVar37 = vmulps_avx512vl(auVar40,auVar37);
      auVar36 = vfmadd231ps_fma(auVar44,auVar51,auVar46);
      auVar45 = vfmadd231ps_fma(auVar45,auVar51,auVar47);
      auVar46 = vfmadd231ps_avx512vl(auVar37,auVar51,auVar49);
      auVar44 = vmulps_avx512vl(auVar40,auVar42);
      auVar47 = vmulps_avx512vl(auVar40,auVar41);
      auVar35 = vmulps_avx512vl(auVar40,auVar35);
      auVar49 = vfmadd231ps_fma(auVar44,auVar51,auVar48);
      auVar52 = vfmadd231ps_fma(auVar47,auVar51,auVar52);
      local_1488 = *puVar1;
      uStack_1480 = puVar1[1];
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      uVar3 = *(undefined4 *)(ray + k * 4);
      auVar41._4_4_ = uVar3;
      auVar41._0_4_ = uVar3;
      auVar41._8_4_ = uVar3;
      auVar41._12_4_ = uVar3;
      auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
      auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar71._4_4_ = uVar3;
      auVar71._0_4_ = uVar3;
      auVar71._8_4_ = uVar3;
      auVar71._12_4_ = uVar3;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar86._4_4_ = uVar3;
      auVar86._0_4_ = uVar3;
      auVar86._8_4_ = uVar3;
      auVar86._12_4_ = uVar3;
      auVar50 = vfmadd231ps_fma(auVar35,auVar51,auVar50);
      fVar70 = *(float *)(ray + k * 4 + 0x60);
      auVar94._4_4_ = fVar70;
      auVar94._0_4_ = fVar70;
      auVar94._8_4_ = fVar70;
      auVar94._12_4_ = fVar70;
      auVar44 = vsubps_avx(auVar33,auVar41);
      auVar33 = vsubps_avx512vl(auVar43,auVar37);
      auVar34 = vsubps_avx512vl(auVar34,auVar38);
      auVar47 = vsubps_avx(auVar36,auVar41);
      auVar36 = vsubps_avx512vl(auVar45,auVar37);
      auVar45 = vsubps_avx512vl(auVar46,auVar38);
      auVar49 = vsubps_avx512vl(auVar49,auVar41);
      auVar46 = vsubps_avx512vl(auVar52,auVar37);
      auVar50 = vsubps_avx512vl(auVar50,auVar38);
      auVar35 = vsubps_avx512vl(auVar49,auVar44);
      auVar37 = vsubps_avx512vl(auVar46,auVar33);
      auVar38 = vsubps_avx512vl(auVar50,auVar34);
      auVar41 = vsubps_avx512vl(auVar44,auVar47);
      auVar39 = vsubps_avx512vl(auVar33,auVar36);
      auVar40 = vsubps_avx512vl(auVar34,auVar45);
      auVar42 = vsubps_avx512vl(auVar47,auVar49);
      auVar43 = vsubps_avx512vl(auVar36,auVar46);
      auVar51 = vsubps_avx512vl(auVar45,auVar50);
      auVar52 = vaddps_avx512vl(auVar49,auVar44);
      auVar53 = vaddps_avx512vl(auVar46,auVar33);
      auVar54 = vaddps_avx512vl(auVar50,auVar34);
      auVar55 = vmulps_avx512vl(auVar53,auVar38);
      auVar55 = vfmsub231ps_avx512vl(auVar55,auVar37,auVar54);
      auVar54 = vmulps_avx512vl(auVar54,auVar35);
      auVar54 = vfmsub231ps_avx512vl(auVar54,auVar38,auVar52);
      auVar61._0_4_ = auVar37._0_4_ * auVar52._0_4_;
      auVar61._4_4_ = auVar37._4_4_ * auVar52._4_4_;
      auVar61._8_4_ = auVar37._8_4_ * auVar52._8_4_;
      auVar61._12_4_ = auVar37._12_4_ * auVar52._12_4_;
      auVar52 = vfmsub231ps_fma(auVar61,auVar35,auVar53);
      auVar53._0_4_ = fVar70 * auVar52._0_4_;
      auVar53._4_4_ = fVar70 * auVar52._4_4_;
      auVar53._8_4_ = fVar70 * auVar52._8_4_;
      auVar53._12_4_ = fVar70 * auVar52._12_4_;
      auVar52 = vfmadd231ps_avx512vl(auVar53,auVar86,auVar54);
      local_1468 = vfmadd231ps_avx512vl(auVar52,auVar71,auVar55);
      auVar55._0_4_ = auVar47._0_4_ + auVar44._0_4_;
      auVar55._4_4_ = auVar47._4_4_ + auVar44._4_4_;
      auVar55._8_4_ = auVar47._8_4_ + auVar44._8_4_;
      auVar55._12_4_ = auVar47._12_4_ + auVar44._12_4_;
      auVar52 = vaddps_avx512vl(auVar33,auVar36);
      auVar53 = vaddps_avx512vl(auVar34,auVar45);
      auVar54 = vmulps_avx512vl(auVar52,auVar40);
      auVar54 = vfmsub231ps_avx512vl(auVar54,auVar39,auVar53);
      auVar53 = vmulps_avx512vl(auVar53,auVar41);
      auVar53 = vfmsub231ps_avx512vl(auVar53,auVar40,auVar55);
      auVar55 = vmulps_avx512vl(auVar55,auVar39);
      auVar52 = vfmsub231ps_avx512vl(auVar55,auVar41,auVar52);
      auVar62._0_4_ = fVar70 * auVar52._0_4_;
      auVar62._4_4_ = fVar70 * auVar52._4_4_;
      auVar62._8_4_ = fVar70 * auVar52._8_4_;
      auVar62._12_4_ = fVar70 * auVar52._12_4_;
      auVar52 = vfmadd231ps_avx512vl(auVar62,auVar86,auVar53);
      local_1458 = vfmadd231ps_avx512vl(auVar52,auVar71,auVar54);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar47 = vaddps_avx512vl(auVar47,auVar49);
      auVar52 = vaddps_avx512vl(auVar36,auVar46);
      auVar49 = vaddps_avx512vl(auVar45,auVar50);
      auVar50 = vmulps_avx512vl(auVar52,auVar51);
      auVar50 = vfmsub231ps_avx512vl(auVar50,auVar43,auVar49);
      auVar49 = vmulps_avx512vl(auVar49,auVar42);
      auVar49 = vfmsub231ps_avx512vl(auVar49,auVar51,auVar47);
      auVar36._0_4_ = auVar47._0_4_ * auVar43._0_4_;
      auVar36._4_4_ = auVar47._4_4_ * auVar43._4_4_;
      auVar36._8_4_ = auVar47._8_4_ * auVar43._8_4_;
      auVar36._12_4_ = auVar47._12_4_ * auVar43._12_4_;
      auVar47 = vfmsub231ps_fma(auVar36,auVar42,auVar52);
      auVar47 = vmulps_avx512vl(auVar47,auVar94);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar86,auVar49);
      auVar49 = vfmadd231ps_avx512vl(auVar47,auVar71,auVar50);
      auVar50._0_4_ = local_1468._0_4_ + local_1458._0_4_;
      auVar50._4_4_ = local_1468._4_4_ + local_1458._4_4_;
      auVar50._8_4_ = local_1468._8_4_ + local_1458._8_4_;
      auVar50._12_4_ = local_1468._12_4_ + local_1458._12_4_;
      local_1448 = vaddps_avx512vl(auVar49,auVar50);
      auVar50 = vandps_avx512vl(local_1448,auVar53);
      auVar47._8_4_ = 0x34000000;
      auVar47._0_8_ = 0x3400000034000000;
      auVar47._12_4_ = 0x34000000;
      auVar47 = vmulps_avx512vl(auVar50,auVar47);
      auVar52 = vminps_avx512vl(local_1468,local_1458);
      auVar36 = vminps_avx512vl(auVar52,auVar49);
      auVar52._8_4_ = 0x80000000;
      auVar52._0_8_ = 0x8000000080000000;
      auVar52._12_4_ = 0x80000000;
      auVar52 = vxorps_avx512vl(auVar47,auVar52);
      uVar9 = vcmpps_avx512vl(auVar36,auVar52,5);
      auVar52 = vmaxps_avx512vl(local_1468,local_1458);
      auVar52 = vmaxps_avx512vl(auVar52,auVar49);
      uVar10 = vcmpps_avx512vl(auVar52,auVar47,2);
      local_1430 = ((byte)uVar9 | (byte)uVar10) & 0xf;
      if (local_1430 != 0) {
        auVar47 = vmulps_avx512vl(auVar39,auVar38);
        auVar52 = vmulps_avx512vl(auVar35,auVar40);
        auVar49 = vmulps_avx512vl(auVar41,auVar37);
        auVar36 = vmulps_avx512vl(auVar43,auVar40);
        auVar45 = vmulps_avx512vl(auVar41,auVar51);
        auVar46 = vmulps_avx512vl(auVar42,auVar39);
        auVar37 = vfmsub213ps_avx512vl(auVar37,auVar40,auVar47);
        auVar38 = vfmsub213ps_avx512vl(auVar38,auVar41,auVar52);
        auVar35 = vfmsub213ps_avx512vl(auVar35,auVar39,auVar49);
        auVar39 = vfmsub213ps_avx512vl(auVar51,auVar39,auVar36);
        auVar40 = vfmsub213ps_avx512vl(auVar42,auVar40,auVar45);
        auVar41 = vfmsub213ps_avx512vl(auVar43,auVar41,auVar46);
        auVar47 = vandps_avx512vl(auVar47,auVar53);
        auVar36 = vandps_avx512vl(auVar36,auVar53);
        uVar28 = vcmpps_avx512vl(auVar47,auVar36,1);
        auVar47 = vandps_avx512vl(auVar52,auVar53);
        auVar52 = vandps_avx512vl(auVar45,auVar53);
        uVar17 = vcmpps_avx512vl(auVar47,auVar52,1);
        auVar47 = vandps_avx512vl(auVar49,auVar53);
        auVar52 = vandps_avx512vl(auVar46,auVar53);
        uVar32 = vcmpps_avx512vl(auVar47,auVar52,1);
        bVar8 = (bool)((byte)uVar28 & 1);
        local_13f8._0_4_ = (uint)bVar8 * auVar37._0_4_ | (uint)!bVar8 * auVar39._0_4_;
        bVar8 = (bool)((byte)(uVar28 >> 1) & 1);
        local_13f8._4_4_ = (uint)bVar8 * auVar37._4_4_ | (uint)!bVar8 * auVar39._4_4_;
        bVar8 = (bool)((byte)(uVar28 >> 2) & 1);
        local_13f8._8_4_ = (uint)bVar8 * auVar37._8_4_ | (uint)!bVar8 * auVar39._8_4_;
        bVar8 = (bool)((byte)(uVar28 >> 3) & 1);
        local_13f8._12_4_ = (uint)bVar8 * auVar37._12_4_ | (uint)!bVar8 * auVar39._12_4_;
        bVar8 = (bool)((byte)uVar17 & 1);
        local_13e8._0_4_ = (uint)bVar8 * auVar38._0_4_ | (uint)!bVar8 * auVar40._0_4_;
        bVar8 = (bool)((byte)(uVar17 >> 1) & 1);
        local_13e8._4_4_ = (uint)bVar8 * auVar38._4_4_ | (uint)!bVar8 * auVar40._4_4_;
        bVar8 = (bool)((byte)(uVar17 >> 2) & 1);
        local_13e8._8_4_ = (uint)bVar8 * auVar38._8_4_ | (uint)!bVar8 * auVar40._8_4_;
        bVar8 = (bool)((byte)(uVar17 >> 3) & 1);
        local_13e8._12_4_ = (uint)bVar8 * auVar38._12_4_ | (uint)!bVar8 * auVar40._12_4_;
        bVar8 = (bool)((byte)uVar32 & 1);
        local_13d8._0_4_ = (float)((uint)bVar8 * auVar35._0_4_ | (uint)!bVar8 * auVar41._0_4_);
        bVar8 = (bool)((byte)(uVar32 >> 1) & 1);
        local_13d8._4_4_ = (float)((uint)bVar8 * auVar35._4_4_ | (uint)!bVar8 * auVar41._4_4_);
        bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
        local_13d8._8_4_ = (float)((uint)bVar8 * auVar35._8_4_ | (uint)!bVar8 * auVar41._8_4_);
        bVar8 = (bool)((byte)(uVar32 >> 3) & 1);
        local_13d8._12_4_ = (float)((uint)bVar8 * auVar35._12_4_ | (uint)!bVar8 * auVar41._12_4_);
        auVar46._0_4_ = fVar70 * local_13d8._0_4_;
        auVar46._4_4_ = fVar70 * local_13d8._4_4_;
        auVar46._8_4_ = fVar70 * local_13d8._8_4_;
        auVar46._12_4_ = fVar70 * local_13d8._12_4_;
        auVar47 = vfmadd213ps_fma(auVar86,local_13e8,auVar46);
        auVar47 = vfmadd213ps_fma(auVar71,local_13f8,auVar47);
        auVar49._0_4_ = auVar47._0_4_ + auVar47._0_4_;
        auVar49._4_4_ = auVar47._4_4_ + auVar47._4_4_;
        auVar49._8_4_ = auVar47._8_4_ + auVar47._8_4_;
        auVar49._12_4_ = auVar47._12_4_ + auVar47._12_4_;
        auVar45._0_4_ = auVar34._0_4_ * local_13d8._0_4_;
        auVar45._4_4_ = auVar34._4_4_ * local_13d8._4_4_;
        auVar45._8_4_ = auVar34._8_4_ * local_13d8._8_4_;
        auVar45._12_4_ = auVar34._12_4_ * local_13d8._12_4_;
        auVar47 = vfmadd213ps_fma(auVar33,local_13e8,auVar45);
        auVar47 = vfmadd213ps_fma(auVar44,local_13f8,auVar47);
        auVar44 = vrcp14ps_avx512vl(auVar49);
        auVar52 = vfnmadd213ps_avx512vl(auVar44,auVar49,auVar48);
        auVar44 = vfmadd132ps_fma(auVar52,auVar44,auVar44);
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar33._4_4_ = uVar3;
        auVar33._0_4_ = uVar3;
        auVar33._8_4_ = uVar3;
        auVar33._12_4_ = uVar3;
        auVar93 = ZEXT1664(auVar33);
        local_1408._0_4_ = auVar44._0_4_ * (auVar47._0_4_ + auVar47._0_4_);
        local_1408._4_4_ = auVar44._4_4_ * (auVar47._4_4_ + auVar47._4_4_);
        local_1408._8_4_ = auVar44._8_4_ * (auVar47._8_4_ + auVar47._8_4_);
        local_1408._12_4_ = auVar44._12_4_ * (auVar47._12_4_ + auVar47._12_4_);
        uVar9 = vcmpps_avx512vl(local_1408,auVar33,2);
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar44._4_4_ = uVar3;
        auVar44._0_4_ = uVar3;
        auVar44._8_4_ = uVar3;
        auVar44._12_4_ = uVar3;
        uVar10 = vcmpps_avx512vl(local_1408,auVar44,0xd);
        local_1430 = (byte)uVar9 & (byte)uVar10 & local_1430;
        if (local_1430 != 0) {
          uVar9 = vcmpps_avx512vl(auVar49,_DAT_01f45a50,4);
          local_1430 = local_1430 & (byte)uVar9;
          if (local_1430 != 0) {
            auVar34._8_4_ = 0x219392ef;
            auVar34._0_8_ = 0x219392ef219392ef;
            auVar34._12_4_ = 0x219392ef;
            uVar28 = vcmpps_avx512vl(auVar50,auVar34,5);
            auVar44 = vrcp14ps_avx512vl(local_1448);
            auVar47 = vfnmadd213ps_avx512vl(local_1448,auVar44,auVar48);
            auVar44 = vfmadd132ps_avx512vl(auVar47,auVar44,auVar44);
            fVar63 = (float)((uint)((byte)uVar28 & 1) * auVar44._0_4_);
            fVar85 = (float)((uint)((byte)(uVar28 >> 1) & 1) * auVar44._4_4_);
            fVar78 = (float)((uint)((byte)(uVar28 >> 2) & 1) * auVar44._8_4_);
            fVar70 = (float)((uint)((byte)(uVar28 >> 3) & 1) * auVar44._12_4_);
            local_1438 = &mapUV;
            auVar35._0_4_ = fVar63 * local_1468._0_4_;
            auVar35._4_4_ = fVar85 * local_1468._4_4_;
            auVar35._8_4_ = fVar78 * local_1468._8_4_;
            auVar35._12_4_ = fVar70 * local_1468._12_4_;
            local_1428 = vminps_avx512vl(auVar35,auVar48);
            auVar37._0_4_ = fVar63 * local_1458._0_4_;
            auVar37._4_4_ = fVar85 * local_1458._4_4_;
            auVar37._8_4_ = fVar78 * local_1458._8_4_;
            auVar37._12_4_ = fVar70 * local_1458._12_4_;
            local_1418 = vminps_avx512vl(auVar37,auVar48);
            uVar28 = (ulong)local_1430;
            do {
              uVar17 = 0;
              for (uVar32 = uVar28; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                uVar17 = uVar17 + 1;
              }
              pGVar6 = (pSVar5->geometries).items[*(uint *)((long)&local_1478 + uVar17 * 4)].ptr;
              if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01da3936:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  goto LAB_01da394a;
                }
                uVar32 = (ulong)(uint)((int)uVar17 * 4);
                uVar3 = *(undefined4 *)(local_1428 + uVar32);
                local_12f8._4_4_ = uVar3;
                local_12f8._0_4_ = uVar3;
                local_12f8._8_4_ = uVar3;
                local_12f8._12_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_1418 + uVar32);
                local_12e8._4_4_ = uVar3;
                local_12e8._0_4_ = uVar3;
                local_12e8._8_4_ = uVar3;
                local_12e8._12_4_ = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1408 + uVar32);
                args.context = context->user;
                local_12c8 = vpbroadcastd_avx512vl();
                uVar3 = *(undefined4 *)((long)&local_1488 + uVar32);
                local_12d8._4_4_ = uVar3;
                local_12d8._0_4_ = uVar3;
                local_12d8._8_4_ = uVar3;
                local_12d8._12_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_13f8 + uVar32);
                uVar4 = *(undefined4 *)(local_13e8 + uVar32);
                local_1318._4_4_ = uVar4;
                local_1318._0_4_ = uVar4;
                local_1318._8_4_ = uVar4;
                local_1318._12_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_13d8 + uVar32);
                local_1308._4_4_ = uVar4;
                local_1308._0_4_ = uVar4;
                local_1308._8_4_ = uVar4;
                local_1308._12_4_ = uVar4;
                local_1328[0] = (RTCHitN)(char)uVar3;
                local_1328[1] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1328[2] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1328[3] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1328[4] = (RTCHitN)(char)uVar3;
                local_1328[5] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1328[6] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1328[7] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1328[8] = (RTCHitN)(char)uVar3;
                local_1328[9] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1328[10] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1328[0xb] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1328[0xc] = (RTCHitN)(char)uVar3;
                local_1328[0xd] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1328[0xe] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1328[0xf] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                vpcmpeqd_avx2(ZEXT1632(local_12c8),ZEXT1632(local_12c8));
                uStack_12b4 = (args.context)->instID[0];
                local_12b8 = uStack_12b4;
                uStack_12b0 = uStack_12b4;
                uStack_12ac = uStack_12b4;
                uStack_12a8 = (args.context)->instPrimID[0];
                uStack_12a4 = uStack_12a8;
                uStack_12a0 = uStack_12a8;
                uStack_129c = uStack_12a8;
                args.valid = (int *)local_1508;
                args.geometryUserPtr = pGVar6->userPtr;
                args.hit = local_1328;
                args.N = 4;
                local_1348 = auVar97._0_32_;
                local_1368 = auVar98._0_32_;
                local_1388 = auVar99._0_32_;
                local_13a8 = auVar100._0_32_;
                local_13c8 = auVar101._0_32_;
                auVar44 = auVar93._0_16_;
                local_1508 = auVar12;
                args.ray = (RTCRayN *)ray;
                if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar6->occlusionFilterN)(&args);
                  auVar93 = ZEXT1664(auVar44);
                  auVar101 = ZEXT3264(local_13c8);
                  auVar100 = ZEXT3264(local_13a8);
                  auVar99 = ZEXT3264(local_1388);
                  auVar98 = ZEXT3264(local_1368);
                  auVar97 = ZEXT3264(local_1348);
                }
                uVar32 = vptestmd_avx512vl(local_1508,local_1508);
                if ((uVar32 & 0xf) != 0) {
                  p_Var7 = context->args->filter;
                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var7)(&args);
                    auVar93 = ZEXT1664(auVar44);
                    auVar101 = ZEXT3264(local_13c8);
                    auVar100 = ZEXT3264(local_13a8);
                    auVar99 = ZEXT3264(local_1388);
                    auVar98 = ZEXT3264(local_1368);
                    auVar97 = ZEXT3264(local_1348);
                  }
                  auVar44 = *(undefined1 (*) [16])(args.ray + 0x80);
                  uVar32 = vptestmd_avx512vl(local_1508,local_1508);
                  uVar32 = uVar32 & 0xf;
                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar8 = (bool)((byte)uVar32 & 1);
                  auVar48._0_4_ = (uint)bVar8 * auVar47._0_4_ | (uint)!bVar8 * auVar44._0_4_;
                  bVar8 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar48._4_4_ = (uint)bVar8 * auVar47._4_4_ | (uint)!bVar8 * auVar44._4_4_;
                  bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar48._8_4_ = (uint)bVar8 * auVar47._8_4_ | (uint)!bVar8 * auVar44._8_4_;
                  bVar8 = SUB81(uVar32 >> 3,0);
                  auVar48._12_4_ = (uint)bVar8 * auVar47._12_4_ | (uint)!bVar8 * auVar44._12_4_;
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar48;
                  if ((byte)uVar32 != 0) goto LAB_01da3936;
                }
                *(int *)(ray + k * 4 + 0x80) = auVar93._0_4_;
              }
              uVar28 = uVar28 ^ 1L << (uVar17 & 0x3f);
            } while (uVar28 != 0);
          }
        }
      }
      auVar93 = ZEXT3264(local_1278);
      auVar95 = ZEXT3264(local_1298);
      auVar96 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar28 = local_14f0;
      fVar63 = local_11f8;
      fVar64 = fStack_11f4;
      fVar65 = fStack_11f0;
      fVar66 = fStack_11ec;
      fVar67 = fStack_11e8;
      fVar68 = fStack_11e4;
      fVar69 = fStack_11e0;
      fVar70 = local_1218;
      fVar72 = fStack_1214;
      fVar73 = fStack_1210;
      fVar74 = fStack_120c;
      fVar75 = fStack_1208;
      fVar76 = fStack_1204;
      fVar77 = fStack_1200;
      fVar78 = local_1238;
      fVar79 = fStack_1234;
      fVar80 = fStack_1230;
      fVar81 = fStack_122c;
      fVar82 = fStack_1228;
      fVar83 = fStack_1224;
      fVar84 = fStack_1220;
      fVar85 = local_1258;
      fVar87 = fStack_1254;
      fVar88 = fStack_1250;
      fVar89 = fStack_124c;
      fVar90 = fStack_1248;
      fVar91 = fStack_1244;
      fVar92 = fStack_1240;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }